

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O2

void __thiscall SQLiteTestFixture::setup(SQLiteTestFixture *this)

{
  string *psVar1;
  allocator<char> local_1d9;
  string local_1d8;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  char *local_1a0;
  const_string local_168;
  const_string local_158;
  const_string local_148 [4];
  const_string local_108;
  const_string local_f8;
  const_string local_e8 [4];
  const_string local_a8;
  const_string local_98;
  const_string local_88 [4];
  const_string local_48;
  const_string local_38;
  const_string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));",
             &local_1d9);
  cpp_db::statement::statement
            ((statement *)local_1b8,&local_1d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_1b8);
  cpp_db::statement::~statement((statement *)local_1b8);
  psVar1 = &local_1d8;
  std::__cxx11::string::~string((string *)psVar1);
  local_28.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_28.m_end = "";
  local_38.m_begin = "";
  local_38.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_28,0x1b,&local_38);
  local_1d8._M_dataplus._M_p._0_1_ = 1;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_00191248;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "no exceptions thrown by cpp_db::statement(\"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));\", *con).execute_non_query()"
  ;
  local_48.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_48.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_1b8,&local_48,0x1b,CHECK,CHECK_MSG
             ,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')",
             &local_1d9);
  cpp_db::statement::statement
            ((statement *)local_1b8,&local_1d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_1b8);
  cpp_db::statement::~statement((statement *)local_1b8);
  psVar1 = &local_1d8;
  std::__cxx11::string::~string((string *)psVar1);
  local_88[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_88[0].m_end = "";
  local_98.m_begin = "";
  local_98.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,local_88,0x1c,&local_98);
  local_1d8._M_dataplus._M_p._0_1_ = 1;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_001912c8;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')\", *con).execute_non_query()"
  ;
  local_a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_a8.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_1b8,&local_a8,0x1c,CHECK,CHECK_MSG
             ,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')",
             &local_1d9);
  cpp_db::statement::statement
            ((statement *)local_1b8,&local_1d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_1b8);
  cpp_db::statement::~statement((statement *)local_1b8);
  psVar1 = &local_1d8;
  std::__cxx11::string::~string((string *)psVar1);
  local_e8[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_e8[0].m_end = "";
  local_f8.m_begin = "";
  local_f8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,local_e8,0x1d,&local_f8);
  local_1d8._M_dataplus._M_p._0_1_ = 1;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_00191348;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')\", *con).execute_non_query()"
  ;
  local_108.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_108.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_1b8,&local_108,0x1d,CHECK,
             CHECK_MSG,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')",
             &local_1d9);
  cpp_db::statement::statement
            ((statement *)local_1b8,&local_1d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_1b8);
  cpp_db::statement::~statement((statement *)local_1b8);
  psVar1 = &local_1d8;
  std::__cxx11::string::~string((string *)psVar1);
  local_148[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_148[0].m_end = "";
  local_158.m_begin = "";
  local_158.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,local_148,0x1e,&local_158);
  local_1d8._M_dataplus._M_p._0_1_ = 1;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_001912c8;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')\", *con).execute_non_query()"
  ;
  local_168.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_168.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_1b8,&local_168,0x1e,CHECK,
             CHECK_MSG,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  return;
}

Assistant:

void setup()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(1, 'first')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(2, 'second')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(3, 'third')", *con).execute_non_query());
    }